

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.c
# Opt level: O0

void test_reset_then_close(void)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  uint32_t uVar4;
  uint uVar5;
  quicly_stream_t *pqVar6;
  quicly_stream_t **unaff_retaddr;
  quicly_conn_t *in_stack_00000008;
  int ret;
  uint64_t stream_id;
  test_streambuf_t *server_streambuf;
  test_streambuf_t *client_streambuf;
  quicly_stream_t *server_stream;
  quicly_stream_t *client_stream;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  quicly_conn_t *conn;
  undefined4 local_8;
  int in_stack_fffffffffffffffc;
  
  iVar3 = quicly_open_stream(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffffc);
  _ok((int)(ulong)(iVar3 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xa6
     );
  conn = *(quicly_conn_t **)(CONCAT44(in_stack_fffffffffffffffc,local_8) + 8);
  lVar1 = *(long *)(CONCAT44(in_stack_fffffffffffffffc,local_8) + 0xb0);
  quicly_reset_stream((quicly_stream_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  quicly_request_stop((quicly_stream_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd0),
                      in_stack_ffffffffffffffcc);
  transmit(client,server);
  uVar4 = quicly_num_streams(server);
  _ok((int)(ulong)(uVar4 == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xaf
     );
  pqVar6 = quicly_get_stream(conn,CONCAT44(iVar3,in_stack_ffffffffffffffd0));
  _ok((int)(ulong)(pqVar6 != (quicly_stream_t *)0x0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xb1
     );
  pvVar2 = pqVar6->data;
  uVar5 = quicly_sendstate_transfer_complete(&pqVar6->sendstate);
  _ok((int)(ulong)uVar5,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xb3
     );
  uVar5 = quicly_recvstate_transfer_complete(&pqVar6->recvstate);
  _ok((int)(ulong)uVar5,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xb4
     );
  _ok((int)(ulong)(*(int *)((long)pvVar2 + 0x4c) == 0x33039),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xb5
     );
  _ok((int)(ulong)(*(int *)((long)pvVar2 + 0x48) == 0x3d431),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xb6
     );
  quic_now = quic_now + 0x19;
  transmit(server,client);
  _ok((int)(ulong)*(uint *)(lVar1 + 0x50),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xbc
     );
  _ok((int)(ulong)(*(int *)(lVar1 + 0x48) == -1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xbd
     );
  _ok((int)(ulong)(*(int *)(lVar1 + 0x4c) == 0x3d431),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xbe
     );
  uVar4 = quicly_num_streams(client);
  _ok((int)(ulong)(uVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xbf
     );
  quic_now = quic_now + 0x19;
  transmit(client,server);
  _ok((int)(ulong)*(uint *)((long)pvVar2 + 0x50),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xc4
     );
  uVar4 = quicly_num_streams(server);
  _ok((int)(ulong)(uVar4 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/simple.c",0xc5
     );
  return;
}

Assistant:

static void test_reset_then_close(void)
{
    quicly_stream_t *client_stream, *server_stream;
    test_streambuf_t *client_streambuf, *server_streambuf;
    uint64_t stream_id;
    int ret;

    /* client sends STOP_SENDING and RESET_STREAM */
    ret = quicly_open_stream(client, &client_stream, 0);
    ok(ret == 0);
    stream_id = client_stream->stream_id;
    client_streambuf = client_stream->data;
    quicly_reset_stream(client_stream, QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(12345));
    quicly_request_stop(client_stream, QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(54321));

    transmit(client, server);

    /* server sends RESET_STREAM and ACKs to the packets received */
    ok(quicly_num_streams(server) == 1);
    server_stream = quicly_get_stream(server, stream_id);
    ok(server_stream != NULL);
    server_streambuf = server_stream->data;
    ok(quicly_sendstate_transfer_complete(&server_stream->sendstate));
    ok(quicly_recvstate_transfer_complete(&server_stream->recvstate));
    ok(server_streambuf->error_received.reset_stream == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(12345));
    ok(server_streambuf->error_received.stop_sending == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(54321));

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;
    transmit(server, client);

    /* client closes the stream */
    ok(client_streambuf->is_detached);
    ok(client_streambuf->error_received.stop_sending == -1);
    ok(client_streambuf->error_received.reset_stream == QUICLY_ERROR_FROM_APPLICATION_ERROR_CODE(54321));
    ok(quicly_num_streams(client) == 0);

    quic_now += QUICLY_DELAYED_ACK_TIMEOUT;
    transmit(client, server);

    ok(server_streambuf->is_detached);
    ok(quicly_num_streams(server) == 0);
}